

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::BuildFieldOfTable
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,size_t offset,
          string *code_ptr)

{
  IdlNamer *pIVar1;
  BaseType BVar2;
  Parser *pPVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  string field_var;
  string field_method;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  string field_ty;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pIVar1 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[7])(&local_d0,pIVar1);
  (*(this->namer_).super_Namer._vptr_Namer[4])(&local_b0,pIVar1,field);
  GenFieldTy_abi_cxx11_(&local_70,this,field);
  if ((((this->super_BaseGenerator).parser_)->opts).python_no_type_prefix_suffix == true) {
    std::operator+(&local_90,"Add",&local_b0);
  }
  else {
    (*(pIVar1->super_Namer)._vptr_Namer[0xf])(&local_110,pIVar1,struct_def);
    std::operator+(&local_130,&local_110,"Add");
    std::operator+(&local_90,&local_130,&local_b0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
  }
  std::operator+(&local_130,"def ",&local_90);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_130);
  if ((((this->super_BaseGenerator).parser_)->opts).python_typing == true) {
    std::operator+(&local_f0,"(builder: flatbuffers.Builder, ",&local_d0);
    std::operator+(&local_110,&local_f0,": ");
    std::operator+(&local_130,&local_110,&local_70);
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    pbVar4 = &local_f0;
  }
  else {
    std::operator+(&local_130,"(builder, ",&local_d0);
    std::__cxx11::string::append((string *)code_ptr);
    pbVar4 = &local_130;
  }
  std::__cxx11::string::~string((string *)pbVar4);
  std::__cxx11::string::append((char *)code_ptr);
  std::operator+(&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_,"builder.Prepend");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_130);
  GenMethod_abi_cxx11_(&local_110,this,field);
  std::operator+(&local_130,&local_110,"Slot(");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  NumToString<unsigned_long>(&local_110,offset);
  std::operator+(&local_130,&local_110,", ");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  if (((field->value).type.base_type - BASE_TYPE_UTYPE < 0xc) || (struct_def->fixed != false)) {
    std::__cxx11::string::append((string *)code_ptr);
  }
  else {
    std::__cxx11::string::append((char *)code_ptr);
    std::operator+(&local_110,"(",&local_d0);
    std::operator+(&local_130,&local_110,")");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
  }
  std::__cxx11::string::append((char *)code_ptr);
  BVar2 = (field->value).type.base_type;
  if ((BVar2 - BASE_TYPE_UTYPE < 0xc) && (field->presence == kOptional)) {
    std::__cxx11::string::append((char *)code_ptr);
  }
  else if (BVar2 - BASE_TYPE_FLOAT < 2) {
    FloatConstantGenerator::GenFloatConstant_abi_cxx11_
              (&local_130,&(this->float_const_gen_).super_FloatConstantGenerator,field);
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_130);
  }
  else {
    std::__cxx11::string::append((string *)code_ptr);
  }
  std::__cxx11::string::append((char *)code_ptr);
  pPVar3 = (this->super_BaseGenerator).parser_;
  if (((pPVar3->opts).one_file == false) && ((pPVar3->opts).python_no_type_prefix_suffix == false))
  {
    std::operator+(&local_130,"def Add",&local_b0);
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_130);
    if ((((this->super_BaseGenerator).parser_)->opts).python_typing == true) {
      std::operator+(&local_f0,"(builder: flatbuffers.Builder, ",&local_d0);
      std::operator+(&local_110,&local_f0,": ");
      std::operator+(&local_130,&local_110,&local_70);
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_110);
      pbVar4 = &local_f0;
    }
    else {
      std::operator+(&local_130,"(builder, ",&local_d0);
      std::__cxx11::string::append((string *)code_ptr);
      pbVar4 = &local_130;
    }
    std::__cxx11::string::~string((string *)pbVar4);
    std::__cxx11::string::append((char *)code_ptr);
    (*(pIVar1->super_Namer)._vptr_Namer[0xf])(&local_50,pIVar1,struct_def);
    std::operator+(&local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(anonymous_namespace)::Indent_abi_cxx11_,&local_50);
    std::operator+(&local_110,&local_f0,"Add");
    std::operator+(&local_130,&local_110,&local_b0);
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::append((char *)code_ptr);
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::append((char *)code_ptr);
  }
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  return;
}

Assistant:

void BuildFieldOfTable(const StructDef &struct_def, const FieldDef &field,
                         const size_t offset, std::string *code_ptr) const {
    auto &code = *code_ptr;
    const std::string field_var = namer_.Variable(field);
    const std::string field_method = namer_.Method(field);
    const std::string field_ty = GenFieldTy(field);

    const auto name = parser_.opts.python_no_type_prefix_suffix
                          ? "Add" + field_method
                          : namer_.Type(struct_def) + "Add" + field_method;

    // Generate method with struct name.
    code += "def " + name;
    if (parser_.opts.python_typing) {
      code += "(builder: flatbuffers.Builder, " + field_var + ": " + field_ty;
    } else {
      code += "(builder, " + field_var;
    }
    code += "):\n";
    code += Indent + "builder.Prepend";
    code += GenMethod(field) + "Slot(";
    code += NumToString(offset) + ", ";
    if (!IsScalar(field.value.type.base_type) && (!struct_def.fixed)) {
      code += "flatbuffers.number_types.UOffsetTFlags.py_type";
      code += "(" + field_var + ")";
    } else {
      code += field_var;
    }
    code += ", ";
    if (field.IsScalarOptional()) {
      code += "None";
    } else if (IsFloat(field.value.type.base_type)) {
      code += float_const_gen_.GenFloatConstant(field);
    } else {
      code += field.value.constant;
    }
    code += ")\n\n";

    if (!parser_.opts.one_file && !parser_.opts.python_no_type_prefix_suffix) {
      // Generate method without struct name.
      code += "def Add" + field_method;
      if (parser_.opts.python_typing) {
        code += "(builder: flatbuffers.Builder, " + field_var + ": " + field_ty;
      } else {
        code += "(builder, " + field_var;
      }
      code += "):\n";
      code += Indent + namer_.Type(struct_def) + "Add" + field_method;
      code += "(builder, ";
      code += field_var;
      code += ")\n\n";
    }
  }